

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

bool tinyusdz::tydra::PrimToPrimSpecImpl<tinyusdz::Xform>(Xform *p,PrimSpec *ps,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> toks;
  Attribute xformOpOrderAttr;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_8d8;
  Attribute local_8b8;
  Property local_610;
  
  ::std::__cxx11::string::_M_assign((string *)&ps->_name);
  ps->_specifier = (p->super_GPrim).spec;
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)&ps->_props,&(p->super_GPrim).props._M_t);
  local_8d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_8d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8b8._name._M_dataplus._M_p = (pointer)&local_8b8._name.field_2;
  local_8b8._name._M_string_length = 0;
  local_8b8._name.field_2._M_local_buf[0] = '\0';
  local_8b8._variability = Varying;
  local_8b8._varying_authored = false;
  paVar1 = &local_8b8._type_name.field_2;
  local_8b8._type_name._M_string_length = 0;
  local_8b8._type_name.field_2._M_local_buf[0] = '\0';
  local_8b8._var._value.v_.vtable =
       (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_8b8._var._value.v_.storage.dynamic = (void *)0x0;
  local_8b8._var._blocked = false;
  local_8b8._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8b8._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_8b8._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_8b8._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_8b8._var._ts._17_8_ = 0;
  local_8b8._metas.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  local_8b8._metas.elementSize.has_value_ = false;
  local_8b8._metas.elementSize.contained = (storage_t<unsigned_int>)0x0;
  local_8b8._metas.hidden.has_value_ = false;
  local_8b8._metas.hidden.contained = (storage_t<bool>)0x0;
  local_8b8._metas.comment.has_value_ = false;
  local_8b8._metas.weight.contained = (storage_t<double>)0x0;
  local_8b8._metas.connectability.has_value_ = false;
  local_8b8._metas.bindMaterialAs.contained._16_8_ = 0;
  local_8b8._metas.bindMaterialAs.contained._24_8_ = 0;
  local_8b8._metas.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
  ;
  local_8b8._metas.bindMaterialAs.contained._8_8_ = 0;
  local_8b8._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_8b8._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header;
  local_8b8._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_8b8._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_8b8._metas.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_8b8._metas.comment.contained._8_8_ = 0;
  local_8b8._metas.comment.contained._16_8_ = 0;
  local_8b8._metas.comment.contained._24_8_ = 0;
  local_8b8._metas.comment.contained._32_8_ = 0;
  local_8b8._metas.comment.contained._40_8_ = 0;
  local_8b8._metas.customData.has_value_ = false;
  local_8b8._metas.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_8b8._metas.customData.contained._8_8_ = 0;
  local_8b8._metas.customData.contained._16_8_ = 0;
  local_8b8._metas.customData.contained._24_8_ = 0;
  local_8b8._metas.customData.contained._32_8_ = 0;
  local_8b8._metas.customData.contained._40_8_ = 0;
  local_8b8._metas.weight.has_value_ = false;
  local_8b8._metas.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
  ;
  local_8b8._metas.connectability.contained._8_8_ = 0;
  local_8b8._metas.connectability.contained._16_8_ = 0;
  local_8b8._metas.connectability.contained._24_8_ = 0;
  local_8b8._metas.outputName.has_value_ = false;
  local_8b8._metas.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_8b8._metas.outputName.contained._8_8_ = 0;
  local_8b8._metas.outputName.contained._16_8_ = 0;
  local_8b8._metas.outputName.contained._24_8_ = 0;
  local_8b8._metas.renderType.has_value_ = false;
  local_8b8._metas.sdrMetadata.has_value_ = false;
  local_8b8._metas.renderType.contained._16_8_ = 0;
  local_8b8._metas.renderType.contained._24_8_ = 0;
  local_8b8._metas.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_8b8._metas.renderType.contained._8_8_ = 0;
  local_8b8._metas.displayName.has_value_ = false;
  local_8b8._metas.sdrMetadata.contained._32_8_ = 0;
  local_8b8._metas.sdrMetadata.contained._40_8_ = 0;
  local_8b8._metas.sdrMetadata.contained._16_8_ = 0;
  local_8b8._metas.sdrMetadata.contained._24_8_ = 0;
  local_8b8._metas.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_8b8._metas.sdrMetadata.contained._8_8_ = 0;
  local_8b8._metas.displayGroup.has_value_ = false;
  local_8b8._metas.displayName.contained._16_8_ = 0;
  local_8b8._metas.displayName.contained._24_8_ = 0;
  local_8b8._metas.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_8b8._metas.displayName.contained._8_8_ = 0;
  local_8b8._metas.bindMaterialAs.has_value_ = false;
  local_8b8._metas.displayGroup.contained._16_8_ = 0;
  local_8b8._metas.displayGroup.contained._24_8_ = 0;
  local_8b8._metas.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_8b8._metas.displayGroup.contained._8_8_ = 0;
  local_8b8._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_8b8._153_8_ = 0;
  local_8b8._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_8b8._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_8b8._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  local_8b8._metas.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_8b8._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8b8._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8b8._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8b8._type_name._M_dataplus._M_p = (pointer)paVar1;
  local_8b8._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_8b8._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Attribute::set_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            (&local_8b8,&local_8d8);
  Property::Property(&local_610,&local_8b8,false);
  ::std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Property>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Property>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
  ::_M_emplace_unique<char_const(&)[13],tinyusdz::Property>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Property>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Property>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
              *)&ps->_props,(char (*) [13])"xformOpOrder",&local_610);
  Property::~Property(&local_610);
  PrimMetas::operator=(&ps->_metas,&(p->super_GPrim).meta);
  AttrMetas::~AttrMetas(&local_8b8._metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_8b8._paths);
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector(&local_8b8._var._ts._samples);
  if (local_8b8._var._value.v_.vtable != (vtable_type *)0x0) {
    (*(local_8b8._var._value.v_.vtable)->destroy)((storage_union *)&local_8b8._var);
    local_8b8._var._value.v_.vtable = (vtable_type *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._type_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_8b8._type_name._M_dataplus._M_p,
                    CONCAT71(local_8b8._type_name.field_2._M_allocated_capacity._1_7_,
                             local_8b8._type_name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._name._M_dataplus._M_p != &local_8b8._name.field_2) {
    operator_delete(local_8b8._name._M_dataplus._M_p,
                    CONCAT71(local_8b8._name.field_2._M_allocated_capacity._1_7_,
                             local_8b8._name.field_2._M_local_buf[0]) + 1);
  }
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_8d8);
  return true;
}

Assistant:

bool PrimToPrimSpecImpl(const Xform &p, PrimSpec &ps, std::string *err) {
  (void)err;

  ps.name() = p.name;
  ps.specifier() = p.spec;

  ps.props() = p.props;

  // TODO..
  std::vector<value::token> toks;
  Attribute xformOpOrderAttr;
  xformOpOrderAttr.set_value(toks);
  ps.props().emplace("xformOpOrder",
                     Property(xformOpOrderAttr, /* custom */ false));

  ps.metas() = p.meta;

  // TODO: variantSet
  // ps.variantSets

  return true;
}